

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

int Kit_TruthBooleanDiffCount(uint *pTruth,int nVars,int iVar)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar8 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar8 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitTruth.c"
                  ,0x3d6,"int Kit_TruthBooleanDiffCount(unsigned int *, int, int)");
  }
  iVar1 = (int)uVar8;
  switch(iVar) {
  case 0:
    uVar9 = 0;
    if (iVar1 < 1) {
      uVar8 = 0;
    }
    iVar5 = 0;
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      iVar1 = Kit_WordCountOnes((pTruth[uVar9] >> 1 ^ pTruth[uVar9]) & 0x55555555);
      iVar5 = iVar5 + iVar1;
    }
    break;
  case 1:
    uVar9 = 0;
    if (iVar1 < 1) {
      uVar8 = 0;
    }
    iVar5 = 0;
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      iVar1 = Kit_WordCountOnes((pTruth[uVar9] >> 2 ^ pTruth[uVar9]) & 0x33333333);
      iVar5 = iVar5 + iVar1;
    }
    break;
  case 2:
    uVar9 = 0;
    if (iVar1 < 1) {
      uVar8 = 0;
    }
    iVar5 = 0;
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      iVar1 = Kit_WordCountOnes((pTruth[uVar9] >> 4 ^ pTruth[uVar9]) & 0xf0f0f0f);
      iVar5 = iVar5 + iVar1;
    }
    break;
  case 3:
    uVar9 = 0;
    if (iVar1 < 1) {
      uVar8 = 0;
    }
    iVar5 = 0;
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      iVar1 = Kit_WordCountOnes((pTruth[uVar9] >> 8 ^ pTruth[uVar9]) & 0xff00ff);
      iVar5 = iVar5 + iVar1;
    }
    break;
  case 4:
    uVar9 = 0;
    if (iVar1 < 1) {
      uVar8 = 0;
    }
    iVar5 = 0;
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      iVar1 = Kit_WordCountOnes(pTruth[uVar9] & 0xffff ^ pTruth[uVar9] >> 0x10);
      iVar5 = iVar5 + iVar1;
    }
    break;
  default:
    bVar4 = (char)iVar - 5;
    uVar2 = 1 << (bVar4 & 0x1f);
    iVar6 = 2 << (bVar4 & 0x1f);
    iVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    iVar5 = 0;
    for (; iVar7 < iVar1; iVar7 = iVar7 + iVar6) {
      for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        iVar3 = Kit_WordCountOnes(pTruth[(long)(int)uVar2 + uVar9] ^ pTruth[uVar9]);
        iVar5 = iVar5 + iVar3;
      }
      pTruth = pTruth + iVar6;
    }
  }
  return iVar5;
}

Assistant:

int Kit_TruthBooleanDiffCount( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step, Counter = 0;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 1)) & 0x55555555 );
        return Counter;
    case 1:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 2)) & 0x33333333 );
        return Counter;
    case 2:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 4)) & 0x0F0F0F0F );
        return Counter;
    case 3:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 8)) & 0x00FF00FF );
        return Counter;
    case 4:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >>16)) & 0x0000FFFF );
        return Counter;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                Counter += Kit_WordCountOnes( pTruth[i] ^ pTruth[Step+i] );
            pTruth += 2*Step;
        }
        return Counter;
    }
}